

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O1

void __thiscall
amrex::StreamRetry::StreamRetry(StreamRetry *this,ostream *a_os,string *a_suffix,int a_maxtries)

{
  pointer pcVar1;
  pos_type pVar2;
  
  this->tries = 0;
  this->maxTries = a_maxtries;
  (this->fileName)._M_dataplus._M_p = (pointer)&(this->fileName).field_2;
  (this->fileName)._M_string_length = 0;
  (this->fileName).field_2._M_local_buf[0] = '\0';
  this->sros = a_os;
  pVar2 = (pos_type)std::ostream::tellp();
  this->spos = pVar2;
  (this->suffix)._M_dataplus._M_p = (pointer)&(this->suffix).field_2;
  pcVar1 = (a_suffix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->suffix,pcVar1,pcVar1 + a_suffix->_M_string_length);
  return;
}

Assistant:

amrex::StreamRetry::StreamRetry(std::ostream &a_os, const std::string &a_suffix,
                                 const int a_maxtries)
    : tries(0), maxTries(a_maxtries), sros(a_os), spos(a_os.tellp()), suffix(a_suffix)
{
}